

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.hpp
# Opt level: O0

void __thiscall Tree::reverseQuickSort(Tree *this,int L,int R)

{
  int iVar1;
  reference pvVar2;
  reference __b;
  reference __x;
  reference __y;
  int local_20;
  int temp;
  int j;
  int i;
  int R_local;
  int L_local;
  Tree *this_local;
  
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&this->m_weightArray,(long)((L + R) / 2));
  iVar1 = *pvVar2;
  local_20 = R;
  temp = L;
  while (temp <= local_20) {
    while (pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&this->m_weightArray,(long)temp), iVar1 < *pvVar2) {
      temp = temp + 1;
    }
    while (pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&this->m_weightArray,(long)local_20), *pvVar2 < iVar1) {
      local_20 = local_20 + -1;
    }
    if (temp <= local_20) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_weightArray,(long)temp);
      __b = std::vector<int,_std::allocator<int>_>::operator[](&this->m_weightArray,(long)local_20);
      std::swap<int>(pvVar2,__b);
      __x = std::
            vector<std::vector<record,_std::allocator<record>_>,_std::allocator<std::vector<record,_std::allocator<record>_>_>_>
            ::operator[](&this->m_vectorArray,(long)temp);
      __y = std::
            vector<std::vector<record,_std::allocator<record>_>,_std::allocator<std::vector<record,_std::allocator<record>_>_>_>
            ::operator[](&this->m_vectorArray,(long)local_20);
      std::swap<record,std::allocator<record>>(__x,__y);
      temp = temp + 1;
      local_20 = local_20 + -1;
    }
  }
  if (L < local_20) {
    reverseQuickSort(this,L,local_20);
  }
  if (temp < R) {
    reverseQuickSort(this,temp,R);
  }
  return;
}

Assistant:

void reverseQuickSort(int L, int R) {
        int i = L;
        int j = R;
        int temp = m_weightArray[(i + j) / 2];
        while (i <= j) {
            while (m_weightArray[i] > temp) {
                i++;
            }
            while (m_weightArray[j] < temp) {
                j--;
            }
            if (i <= j) {
                swap(m_weightArray[i], m_weightArray[j]);
                swap(m_vectorArray[i], m_vectorArray[j]);
                i++;
                j--;
            }
        }
        if (L < j) {
            reverseQuickSort(L, j);
        }
        if (i < R) {
            reverseQuickSort(i, R);
        }
    }